

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Filter.cpp
# Opt level: O0

void __thiscall nv::Kernel2::Kernel2(Kernel2 *this,Kernel2 *k)

{
  undefined1 auVar1 [16];
  ulong uVar2;
  float *pfVar3;
  uint local_1c;
  uint i;
  Kernel2 *k_local;
  Kernel2 *this_local;
  
  this->m_windowSize = k->m_windowSize;
  auVar1 = ZEXT416(this->m_windowSize * this->m_windowSize) * ZEXT816(4);
  uVar2 = auVar1._0_8_;
  if (auVar1._8_8_ != 0) {
    uVar2 = 0xffffffffffffffff;
  }
  pfVar3 = (float *)operator_new__(uVar2);
  this->m_data = pfVar3;
  for (local_1c = 0; local_1c < this->m_windowSize * this->m_windowSize; local_1c = local_1c + 1) {
    this->m_data[local_1c] = k->m_data[local_1c];
  }
  return;
}

Assistant:

Kernel2::Kernel2(const Kernel2 & k) : m_windowSize(k.m_windowSize)
{
	m_data = new float[m_windowSize * m_windowSize];
	for (uint i = 0; i < m_windowSize * m_windowSize; i++) {
		m_data[i] = k.m_data[i];
	}
}